

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O1

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::load_data(segment_impl<ELFIO::Elf32_Phdr> *this)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  const_iterator __begin2;
  undefined4 extraout_var;
  pointer paVar6;
  ulong uVar7;
  char *pcVar8;
  long *plVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  undefined4 extraout_var_00;
  
  iVar5 = (*(this->super_segment)._vptr_segment[3])();
  bVar11 = true;
  if ((iVar5 != 0) &&
     (iVar5 = (*(this->super_segment)._vptr_segment[0xd])(this), CONCAT44(extraout_var,iVar5) != 0))
  {
    uVar1 = (this->ph).p_offset;
    uVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (this->convertor->need_conversion == false) {
      uVar4 = uVar1;
    }
    uVar12 = (ulong)uVar4;
    for (paVar6 = (this->translator->addr_translations).
                  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        paVar6 != (this->translator->addr_translations).
                  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                  ._M_impl.super__Vector_impl_data._M_finish; paVar6 = paVar6 + 0x30) {
      lVar10 = uVar12 - *(long *)paVar6;
      if ((*(long *)paVar6 <= (long)uVar12) && (lVar10 < *(long *)(paVar6 + 0x10))) {
        uVar12 = lVar10 + *(long *)(paVar6 + 0x20);
        break;
      }
    }
    iVar5 = (*(this->super_segment)._vptr_segment[0xd])(this);
    uVar7 = CONCAT44(extraout_var_00,iVar5);
    uVar2 = this->stream_size;
    if ((((uVar12 <= uVar2) && (uVar7 <= uVar2)) && (uVar7 <= uVar2 - uVar12)) &&
       (uVar7 != 0xffffffffffffffff)) {
      pcVar8 = (char *)operator_new__(uVar7 + 1,(nothrow_t *)&std::nothrow);
      pcVar3 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = pcVar8;
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
      }
      std::istream::seekg(this->pstream,uVar12,0);
      pcVar3 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
      if ((pcVar3 != (char *)0x0) &&
         (plVar9 = (long *)std::istream::read((char *)this->pstream,(long)pcVar3),
         (*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) == 0)) {
        (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar7] = '\0';
        this->is_loaded = true;
        return true;
      }
    }
    pcVar3 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl;
    (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
    if (pcVar3 != (char *)0x0) {
      operator_delete__(pcVar3);
    }
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool load_data() const
    {
        if ( PT_NULL == get_type() || 0 == get_file_size() ) {
            return true;
        }

        Elf_Xword p_offset = ( *translator )[( *convertor )( ph.p_offset )];
        Elf_Xword size     = get_file_size();

        // Check for integer overflow in offset calculation
        if (p_offset > get_stream_size()) {
            data = nullptr;
            return false;
        }

        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - p_offset)) {
            data = nullptr;
            return false;
        }

        // Check if size can be safely converted to size_t
        if (size > std::numeric_limits<size_t>::max() - 1) {
            data = nullptr;
            return false;
        }

        data.reset( new ( std::nothrow ) char[(size_t)size + 1] );

        pstream->seekg( p_offset );
        if ( nullptr != data.get() && pstream->read( data.get(), size ) ) {
            data.get()[size] = 0;
        }
        else {
            data = nullptr;
            return false;
        }

        is_loaded = true;

        return true;
    }